

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxBuffer.cpp
# Opt level: O0

void __thiscall Jinx::Buffer::Read(Buffer *this,size_t *pos,void *data,size_t bytes)

{
  unsigned_long *puVar1;
  unsigned_long local_38;
  size_t local_30;
  size_t bytesToCopy;
  size_t bytes_local;
  void *data_local;
  size_t *pos_local;
  Buffer *this_local;
  
  bytesToCopy = bytes;
  bytes_local = (size_t)data;
  data_local = pos;
  pos_local = (size_t *)this;
  if (this->m_size - *pos < bytes) {
    __assert_fail("bytes <= (m_size - *pos)",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                  ,0x22,"void Jinx::Buffer::Read(size_t *, void *, size_t)");
  }
  local_38 = this->m_size - *pos;
  puVar1 = std::min<unsigned_long>(&bytesToCopy,&local_38);
  local_30 = *puVar1;
  if (local_30 != 0) {
    if (local_30 == bytesToCopy) {
      memcpy((void *)bytes_local,this->m_data + *data_local,local_30);
      *(size_t *)data_local = bytesToCopy + *data_local;
      return;
    }
    __assert_fail("bytesToCopy == bytes",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                  ,0x25,"void Jinx::Buffer::Read(size_t *, void *, size_t)");
  }
  __assert_fail("bytesToCopy",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxBuffer.cpp"
                ,0x24,"void Jinx::Buffer::Read(size_t *, void *, size_t)");
}

Assistant:

inline_t void Buffer::Read(size_t * pos, void * data, size_t bytes)
	{
		assert(bytes <= (m_size - *pos));
		size_t bytesToCopy = std::min(bytes, m_size - *pos);
		assert(bytesToCopy);
		assert(bytesToCopy == bytes);
		memcpy(data, m_data + *pos, bytesToCopy);
		*pos += bytes;
	}